

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mod2sparse.c
# Opt level: O0

mod2entry * mod2sparse_insert(mod2sparse *m,int row,int col)

{
  int *piVar1;
  int in_EDX;
  int in_ESI;
  int *in_RDI;
  mod2entry *ne;
  mod2entry *ce;
  mod2entry *re;
  mod2entry *local_28;
  mod2entry *m_00;
  mod2entry *local_8;
  
  if ((((in_ESI < 0) || (*in_RDI <= in_ESI)) || (in_EDX < 0)) || (in_RDI[1] <= in_EDX)) {
    fprintf(_stderr,"mod2sparse_insert: row or column index out of bounds\n");
    exit(1);
  }
  local_8 = *(mod2entry **)(*(long *)(in_RDI + 2) + (long)in_ESI * 0x38 + 8);
  if ((local_8->row < 0) || (local_8->col != in_EDX)) {
    if ((local_8->row < 0) || (local_8->col < in_EDX)) {
      m_00 = local_8->right;
    }
    else {
      m_00 = *(mod2entry **)(*(long *)(in_RDI + 2) + (long)in_ESI * 0x38 + 0x10);
      while( true ) {
        if ((-1 < m_00->row) && (m_00->col == in_EDX)) {
          return m_00;
        }
        if ((m_00->row < 0) || (in_EDX < m_00->col)) break;
        m_00 = m_00->right;
      }
    }
    local_8 = alloc_entry((mod2sparse *)m_00);
    local_8->row = in_ESI;
    local_8->col = in_EDX;
    local_8->left = m_00->left;
    local_8->right = m_00;
    local_8->left->right = local_8;
    local_8->right->left = local_8;
    piVar1 = *(int **)(*(long *)(in_RDI + 4) + (long)in_EDX * 0x38 + 0x18);
    if ((-1 < *piVar1) && (*piVar1 == in_ESI)) {
      fprintf(_stderr,"mod2sparse_insert: Garbled matrix\n");
      exit(1);
    }
    if ((*piVar1 < 0) || (*piVar1 < in_ESI)) {
      local_28 = *(mod2entry **)(piVar1 + 8);
    }
    else {
      local_28 = *(mod2entry **)(*(long *)(in_RDI + 4) + (long)in_EDX * 0x38 + 0x20);
      while( true ) {
        if ((-1 < local_28->row) && (local_28->row == in_ESI)) {
          fprintf(_stderr,"mod2sparse_insert: Garbled matrix\n");
          exit(1);
        }
        if ((local_28->row < 0) || (in_ESI < local_28->row)) break;
        local_28 = local_28->down;
      }
    }
    local_8->up = local_28->up;
    local_8->down = local_28;
    local_8->up->down = local_8;
    local_8->down->up = local_8;
  }
  return local_8;
}

Assistant:

mod2entry *mod2sparse_insert
( mod2sparse *m,
  int row,
  int col
)
{
  mod2entry *re, *ce, *ne;

  if (row<0 || row>=mod2sparse_rows(m) || col<0 || col>=mod2sparse_cols(m))
  { fprintf(stderr,"mod2sparse_insert: row or column index out of bounds\n");
    exit(1);
  }

  /* Find old entry and return it, or allocate new entry and insert into row. */

  re = mod2sparse_last_in_row(m,row);

  if (!mod2sparse_at_end(re) && mod2sparse_col(re)==col) 
  { return re;
  }

  if (mod2sparse_at_end(re) || mod2sparse_col(re)<col) 
  { re = re->right;
  }
  else
  {
    re = mod2sparse_first_in_row(m,row);

    for (;;)
    { 
      if (!mod2sparse_at_end(re) && mod2sparse_col(re)==col) 
      { return re;
      }

      if (mod2sparse_at_end(re) || mod2sparse_col(re)>col)
      { break;
      } 

      re = mod2sparse_next_in_row(re);
    }
  }

  ne = alloc_entry(m);

  ne->row = row;
  ne->col = col;

  ne->left = re->left;
  ne->right = re;
  ne->left->right = ne;
  ne->right->left = ne;

  /* Insert new entry into column.  If we find an existing entry here,
     the matrix must be garbled, since we didn't find it in the row. */

  ce = mod2sparse_last_in_col(m,col);

  if (!mod2sparse_at_end(ce) && mod2sparse_row(ce)==row) 
  { fprintf(stderr,"mod2sparse_insert: Garbled matrix\n");
    exit(1);
  }

  if (mod2sparse_at_end(ce) || mod2sparse_row(ce)<row) 
  { ce = ce->down;
  }
  else
  {
    ce = mod2sparse_first_in_col(m,col);

    for (;;)
    { 
      if (!mod2sparse_at_end(ce) && mod2sparse_row(ce)==row) 
      { fprintf(stderr,"mod2sparse_insert: Garbled matrix\n");
        exit(1);
      }

      if (mod2sparse_at_end(ce) || mod2sparse_row(ce)>row)
      { break;
      } 

      ce = mod2sparse_next_in_col(ce);
    }
  }
    
  ne->up = ce->up;
  ne->down = ce;
  ne->up->down = ne;
  ne->down->up = ne;

  /* Return the new entry. */

  return ne;
}